

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonParse *pParse;
  uchar *zPath;
  JsonNode *pJVar1;
  i64 iVal;
  ulong uVar2;
  int iVar3;
  
  pParse = jsonParseCached(ctx,argv,ctx);
  if (pParse != (JsonParse *)0x0) {
    if (argc == 2) {
      zPath = sqlite3_value_text(argv[1]);
      pJVar1 = jsonLookup(pParse,(char *)zPath,(int *)0x0,ctx);
    }
    else {
      pJVar1 = pParse->aNode;
    }
    if (pJVar1 != (JsonNode *)0x0) {
      if (pJVar1->eType == '\x06') {
        iVal = 0;
        for (uVar2 = 1; (uint)uVar2 <= pJVar1->n; uVar2 = (ulong)((uint)uVar2 + iVar3)) {
          iVar3 = 1;
          if (5 < pJVar1[uVar2].eType) {
            iVar3 = pJVar1[uVar2].n + 1;
          }
          iVal = iVal + 1;
        }
      }
      else {
        iVal = 0;
      }
      sqlite3_result_int64(ctx,iVal);
      return;
    }
  }
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 n = 0;
  u32 i;
  JsonNode *pNode;

  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  assert( p->nNode );
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    pNode = jsonLookup(p, zPath, 0, ctx);
  }else{
    pNode = p->aNode;
  }
  if( pNode==0 ){
    return;
  }
  if( pNode->eType==JSON_ARRAY ){
    assert( (pNode->jnFlags & JNODE_APPEND)==0 );
    for(i=1; i<=pNode->n; n++){
      i += jsonNodeSize(&pNode[i]);
    }
  }
  sqlite3_result_int64(ctx, n);
}